

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_cli.c
# Opt level: O1

void visit_eos(void *userdata,ALboolean okay,uint32 ticks)

{
  undefined8 *puVar1;
  
  if (run_calls == '\x01') {
    wait_until(ticks);
  }
  if (okay == '\0') {
    visit_eos_cold_1();
    puVar1 = (undefined8 *)&stderr;
  }
  else {
    if (dumping == 0) {
      return;
    }
    puts("\n<<< END OF TRACE FILE >>>");
    puVar1 = (undefined8 *)&stdout;
  }
  fflush((FILE *)*puVar1);
  return;
}

Assistant:

void visit_eos(void *userdata, const ALboolean okay, const uint32 ticks)
{
    if (run_calls) {
        wait_until(ticks);
    }

    if (!okay) {
        fprintf(stderr, "\n<<< UNEXPECTED LOG ENTRY. BUG? NEW LOG VERSION? CORRUPT FILE? >>>\n");
        fflush(stderr);
    } else if (dumping) {
        printf("\n<<< END OF TRACE FILE >>>\n");
        fflush(stdout);
    }
}